

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutil.c
# Opt level: O0

int poly_mulmod(uint64_t *p1,uint64_t *p2,size_t n,uint64_t q,uint64_t *result)

{
  ulong in_RCX;
  ulong in_RDX;
  void *in_R8;
  uint64_t tmp;
  size_t j;
  size_t i;
  uint64_t in_stack_ffffffffffffffc0;
  ulong b;
  ulong a;
  
  memset(in_R8,0,in_RDX << 3);
  for (a = 0; a < in_RDX; a = a + 1) {
    for (b = 0; b < in_RDX; b = b + 1) {
      in_stack_ffffffffffffffc0 = mulmod(a,b,in_stack_ffffffffffffffc0);
      if (a + b < in_RDX) {
        *(ulong *)((long)in_R8 + (a + b) * 8) =
             (*(long *)((long)in_R8 + (a + b) * 8) + in_stack_ffffffffffffffc0) % in_RCX;
      }
      else {
        *(ulong *)((long)in_R8 + ((a + b) - in_RDX) * 8) =
             ((*(long *)((long)in_R8 + ((a + b) - in_RDX) * 8) + in_RCX) - in_stack_ffffffffffffffc0
             ) % in_RCX;
      }
    }
  }
  return 0;
}

Assistant:

int poly_mulmod(uint64_t p1[], uint64_t p2[], size_t n, uint64_t q, uint64_t result[]) {

    memset(result, 0, n*sizeof(uint64_t));

    // p1 * p2 mod (x^n + 1)
    // the fact is exploited that x^n = -1   mod (x^n + 1)
    for(size_t i = 0; i < n; i++) {
        for(size_t j = 0; j < n; j++) {
            uint64_t tmp = mulmod(p1[i], p2[j], q);
            if(i+j < n) {
                result[i+j] = (result[i+j] + tmp) % q;
            } else {
                result[i+j-n] = (result[i+j-n] + q - tmp) %q;
            }
        }
    }

    return 0;

}